

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

bool FileExpand::inflate(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint8_t *data,
                        size_t dataSize)

{
  long *plVar1;
  symmetric_filter<boost::iostreams::detail::zlib_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
  local_180;
  zlib_params local_170;
  filtering_ostream os;
  
  if (dataSize != 0 && data != (uint8_t *)0x0) {
    local_170.level = -1;
    local_170.method = 8;
    local_170.strategy = 0;
    local_170.noheader = false;
    local_170.calculate_crc = false;
    local_170.window_bits = -0xf;
    local_170.mem_level = 8;
    boost::iostreams::
    filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
    ::filtering_stream(&os);
    boost::iostreams::
    symmetric_filter<boost::iostreams::detail::zlib_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
    ::symmetric_filter<boost::iostreams::zlib_params>(&local_180,0x1000,&local_170);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::output>
    ::push_impl<boost::iostreams::basic_zlib_decompressor<std::allocator<char>>>
              ((chain_base<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::output>
                *)os.
                  super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                  .
                  super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  .
                  super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .chain_,(basic_zlib_decompressor<std::allocator<char>_> *)&local_180,-1,-1);
    boost::detail::shared_count::~shared_count(&local_180.pimpl_.pn);
    local_180.pimpl_.px = (element_type *)out;
    boost::iostreams::detail::
    chain_client<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>>
    ::push<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((chain_client<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>>
                *)&os,(back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&local_180,-1,-1,(type *)0x0);
    plVar1 = *(long **)(&os.
                         super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                         .super_stream_type.field_0xd8 +
                       (long)os.
                             super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                             .
                             super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             .
                             super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._vptr_chain_client[-3]);
    (**(code **)(*plVar1 + 0x60))(plVar1,data,dataSize);
    boost::iostreams::
    filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
    ::~filtering_stream(&os);
  }
  return true;
}

Assistant:

bool FileExpand::inflate(std::vector<uint8_t>& out, const uint8_t* data, size_t dataSize) {
	if (data && dataSize > 0) {
		try {
			boost::iostreams::zlib_params params;
			params.window_bits = -boost::iostreams::zlib::default_window_bits;
			
			boost::iostreams::filtering_ostream os;
			os.push(boost::iostreams::zlib_decompressor(params));
			os.push(std::back_inserter(out));
			
			boost::iostreams::write(os, reinterpret_cast<const char*>(data), dataSize);
		}
		catch (const std::exception& e) {
			return false;
		}
	}
	
	return true;
}